

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int str_to_label(char *dest,char *host,uint maxlen)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  sVar3 = strlen(host);
  uVar2 = (uint)sVar3;
  if (maxlen < 2 || (int)uVar2 < 1) {
    if (0 < (int)uVar2) {
      return -1;
    }
    uVar2 = 1;
    cVar4 = '\0';
    uVar5 = 0;
  }
  else {
    uVar7 = maxlen - 2;
    if (uVar2 - 1 < maxlen - 2) {
      uVar7 = uVar2 - 1;
    }
    uVar6 = 0;
    cVar4 = '\0';
    uVar5 = 0;
    do {
      iVar1 = (int)uVar6;
      if (host[uVar6] == '.') {
        dest[uVar5] = cVar4;
        uVar5 = (ulong)(iVar1 + 1);
        cVar4 = '\0';
      }
      else {
        dest[uVar6 + 1] = host[uVar6];
        cVar4 = cVar4 + '\x01';
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 + 1 != uVar6);
    if (uVar6 < (uVar2 & 0x7fffffff)) {
      return -1;
    }
    uVar2 = iVar1 + 2;
  }
  dest[uVar5] = cVar4;
  dest[uVar2] = '\0';
  return uVar2 + 1;
}

Assistant:

int str_to_label(char *dest, const char *host, unsigned maxlen) {
  /*
  用于把域名转化成DNS格式
  例如   host = www.bupt.edu.cn
  转化为 host = \x1www\x4bupt\x3edu\x2cn\x0
  */
  int n = strlen(host);
  unsigned last_pos = 0, cumulate = 0;
  int i, j = 1; //空出第一格
  for (i = 0; i < n && j < maxlen; i++, j++) {
    if (host[i] == '.') {
      dest[last_pos] = cumulate;
      cumulate = 0;
      last_pos = j;
    } else {
      dest[j] = host[i];
      cumulate++;
    }
  }
  if (i < n)
    return -1;
  dest[last_pos] = cumulate;
  dest[j] = 0;
  return j + 1;
}